

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void __thiscall
dgMeshEffect::dgMeshEffect
          (dgMeshEffect *this,HaF64 *vertexCloud,HaI32 count,HaI32 strideInByte,HaF64 distTol)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  dgBigVector *pdVar4;
  dgVertexAtribute *pdVar5;
  undefined1 (*vertex) [16];
  dgTemplateVector<double> *pdVar6;
  HaI32 *faceIndexCount;
  HaI32 *faceMaterialIndex;
  HaI32 *vertexIndex;
  HaI32 *normalIndex;
  HaI32 *pHVar7;
  char *__function;
  HaI32 *pHVar8;
  uint faceCount;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  undefined1 auVar11 [16];
  HaF32 local_98 [8];
  dgConvexHull3d convexHull;
  
  dgPolyhedra::dgPolyhedra(&this->super_dgPolyhedra);
  (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>._vptr_dgTree =
       (_func_int **)&PTR__dgMeshEffect_00b42c70;
  (this->super_dgRefCounter)._vptr_dgRefCounter = (_func_int **)&DAT_00b42c90;
  *(undefined8 *)&(this->super_dgRefCounter).m_refCount = 1;
  this->m_maxPointCount = 8;
  this->m_atribCount = 0;
  this->m_maxAtribCount = 8;
  pdVar4 = (dgBigVector *)malloc(0x100);
  this->m_points = pdVar4;
  pdVar5 = (dgVertexAtribute *)malloc(0x300);
  this->m_attib = pdVar5;
  if (3 < count) {
    dgConvexHull3d::dgConvexHull3d(&convexHull,vertexCloud,strideInByte,count,distTol,0x7fffffff);
    faceCount = convexHull.super_dgList<dgConvexHull3DFace>.m_count;
    if (convexHull.super_dgList<dgConvexHull3DFace>.m_count != 0) {
      vertex = (undefined1 (*) [16])malloc((long)(convexHull.m_count << 4));
      if (convexHull.m_count < 0) {
        __function = "T &dgStack<dgVector>::operator[](hacd::HaI32) [T = dgVector]";
LAB_00869c22:
        __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                      ,0x60,__function);
      }
      if ((ulong)(uint)convexHull.m_count != 0) {
        uVar10 = 0;
        pauVar9 = vertex;
        do {
          pdVar6 = &dgArray<dgBigVector>::operator[](&convexHull.m_points,(HaI32)uVar10)->
                    super_dgTemplateVector<double>;
          auVar1 = vcvtpd2ps_avx((undefined1  [32])*pdVar6);
          auVar11._8_4_ = 0x7fffffff;
          auVar11._0_8_ = 0x7fffffff7fffffff;
          auVar11._12_4_ = 0x7fffffff;
          auVar11 = vpandd_avx512vl(auVar1,auVar11);
          auVar2._8_4_ = 0x7f7fffff;
          auVar2._0_8_ = 0x7f7fffff7f7fffff;
          auVar2._12_4_ = 0x7f7fffff;
          uVar3 = vpcmpgtd_avx512vl(auVar11,auVar2);
          if (((uVar3 & 0xf) != 0) || (auVar11 = vmovshdup_avx(auVar1), NAN(auVar11._0_4_))) {
LAB_00869bd7:
            __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                          ,0x12d,"dgVector::dgVector(const dgBigVector &)");
          }
          auVar11 = vshufpd_avx(auVar1,auVar1,1);
          auVar2 = vshufps_avx(auVar1,auVar1,0xff);
          if (NAN(auVar11._0_4_) || NAN(auVar2._0_4_)) goto LAB_00869bd7;
          *pauVar9 = auVar1;
          uVar10 = uVar10 + 1;
          pauVar9 = pauVar9 + 1;
          faceCount = convexHull.super_dgList<dgConvexHull3DFace>.m_count;
        } while ((uint)convexHull.m_count != uVar10);
      }
      local_98[4] = 0.0;
      local_98[5] = 0.0;
      local_98[6] = 0.0;
      local_98[7] = 0.0;
      local_98[0] = 0.0;
      local_98[1] = 1.0;
      local_98[2] = 0.0;
      local_98[3] = 0.0;
      faceIndexCount = (HaI32 *)malloc((long)(int)(faceCount * 4));
      faceMaterialIndex = (HaI32 *)malloc((long)(int)(faceCount * 4));
      vertexIndex = (HaI32 *)malloc((long)(int)(faceCount * 0xc));
      normalIndex = (HaI32 *)malloc((long)(int)(faceCount * 0xc));
      if ((int)faceCount < 0) {
        __function = "T &dgStack<int>::operator[](hacd::HaI32) [T = int]";
        goto LAB_00869c22;
      }
      memset(faceMaterialIndex,0,(ulong)faceCount << 2);
      memset(normalIndex,0,(ulong)(faceCount * 3) << 2);
      if (convexHull.super_dgList<dgConvexHull3DFace>.m_first != (dgListNode *)0x0) {
        pHVar7 = vertexIndex + 2;
        pHVar8 = faceIndexCount;
        do {
          *pHVar8 = 3;
          pHVar8 = pHVar8 + 1;
          *(undefined8 *)(pHVar7 + -2) =
               *(undefined8 *)
                ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index;
          *pHVar7 = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[2];
          pHVar7 = pHVar7 + 3;
          convexHull.super_dgList<dgConvexHull3DFace>.m_first =
               (convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_next;
        } while (convexHull.super_dgList<dgConvexHull3DFace>.m_first != (dgListNode *)0x0);
      }
      BuildFromVertexListIndexList
                (this,faceCount,faceIndexCount,faceMaterialIndex,(HaF32 *)vertex,0x10,vertexIndex,
                 local_98,0x10,normalIndex,local_98 + 4,0x10,normalIndex,local_98 + 4,0x10,
                 normalIndex);
      free(normalIndex);
      free(vertexIndex);
      free(faceMaterialIndex);
      free(faceIndexCount);
      free(vertex);
    }
    dgConvexHull3d::~dgConvexHull3d(&convexHull);
  }
  return;
}

Assistant:

dgMeshEffect::dgMeshEffect (const hacd::HaF64* const vertexCloud, hacd::HaI32 count, hacd::HaI32 strideInByte, hacd::HaF64 distTol)
:dgPolyhedra()
{
	Init(true);
	if (count >= 4) {
		dgConvexHull3d convexHull (vertexCloud, strideInByte, count, distTol);
		if (convexHull.GetCount()) {

			hacd::HaI32 vertexCount = convexHull.GetVertexCount();
			dgStack<dgVector> pointsPool (convexHull.GetVertexCount());
			dgVector* const points = &pointsPool[0];
			for (hacd::HaI32 i = 0; i < vertexCount; i ++) {
				points[i] = convexHull.GetVertex(i);
			}
			dgVector uv(hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
			dgVector normal (hacd::HaF32 (0.0f), hacd::HaF32 (1.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));

			hacd::HaI32 triangleCount = convexHull.GetCount();
			dgStack<hacd::HaI32> faceCountPool (triangleCount);
			dgStack<hacd::HaI32> materialsPool (triangleCount);
			dgStack<hacd::HaI32> vertexIndexListPool (triangleCount * 3);
			dgStack<hacd::HaI32> normalIndexListPool (triangleCount * 3);


			memset (&materialsPool[0], 0, triangleCount * sizeof (hacd::HaI32));
			memset (&normalIndexListPool[0], 0, 3 * triangleCount * sizeof (hacd::HaI32));

			hacd::HaI32 index = 0;
			hacd::HaI32* const faceCount = &faceCountPool[0];
			hacd::HaI32* const vertexIndexList = &vertexIndexListPool[0];
			for (dgConvexHull3d::dgListNode* faceNode = convexHull.GetFirst(); faceNode; faceNode = faceNode->GetNext()) {
				dgConvexHull3DFace& face = faceNode->GetInfo();
				faceCount[index] = 3;
				vertexIndexList[index * 3 + 0] = face.m_index[0]; 
				vertexIndexList[index * 3 + 1] = face.m_index[1]; 
				vertexIndexList[index * 3 + 2] = face.m_index[2]; 
				index ++;
			}

			BuildFromVertexListIndexList(triangleCount, faceCount, &materialsPool[0], 
				&points[0].m_x, sizeof (dgVector), vertexIndexList,
				&normal.m_x, sizeof (dgVector), &normalIndexListPool[0],
				&uv.m_x, sizeof (dgVector), &normalIndexListPool[0],
				&uv.m_x, sizeof (dgVector), &normalIndexListPool[0]);
		}
	}
}